

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_12579f7::TargetIncludeDirectoriesImpl::HandleInterfaceContent
          (TargetIncludeDirectoriesImpl *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  undefined7 in_register_00000081;
  string joined;
  allocator<char> local_89;
  undefined1 local_88 [16];
  _Optional_payload_base<cmListFileBacktrace> local_78;
  string local_60;
  string local_40;
  
  cmTargetPropCommandBase::HandleInterfaceContent
            (&this->super_cmTargetPropCommandBase,tgt,content,prepend,system);
  if ((int)CONCAT71(in_register_00000081,system) != 0) {
    (*(this->super_cmTargetPropCommandBase)._vptr_cmTargetPropCommandBase[6])
              (&local_40,this,content);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES",&local_89);
    cmMakefile::GetBacktrace((cmMakefile *)local_88);
    local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
    .
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)local_88._0_8_;
    local_78._M_payload._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
    .
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)
         (__shared_count<(__gnu_cxx::_Lock_policy)2>)local_88._8_8_;
    local_88._0_8_ = (_Map_pointer)0x0;
    local_88._8_8_ = 0;
    local_78._M_engaged = true;
    cmTarget::AppendProperty
              (tgt,&local_60,&local_40,(optional<cmListFileBacktrace> *)&local_78,false);
    std::_Optional_payload_base<cmListFileBacktrace>::_M_reset(&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return;
}

Assistant:

void TargetIncludeDirectoriesImpl::HandleInterfaceContent(
  cmTarget* tgt, const std::vector<std::string>& content, bool prepend,
  bool system)
{
  this->cmTargetPropCommandBase::HandleInterfaceContent(tgt, content, prepend,
                                                        system);
  if (system) {
    std::string joined = this->Join(content);
    tgt->AppendProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", joined,
                        this->Makefile->GetBacktrace());
  }
}